

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall
Application::onMessage(Application *this,OrderCancelRequest *message,SessionID *param_2)

{
  Side side_00;
  string *id;
  string *symbol_00;
  exception *anon_var_0;
  Side side;
  undefined1 local_d0 [8];
  Symbol symbol;
  OrigClOrdID origClOrdID;
  SessionID *param_2_local;
  OrderCancelRequest *message_local;
  Application *this_local;
  
  FIX::OrigClOrdID::OrigClOrdID((OrigClOrdID *)&symbol.super_StringField.super_FieldBase.m_metrics);
  FIX::Symbol::Symbol((Symbol *)local_d0);
  FIX::Side::Side((Side *)&anon_var_0);
  FIX42::OrderCancelRequest::get
            (message,(OrigClOrdID *)&symbol.super_StringField.super_FieldBase.m_metrics);
  FIX42::OrderCancelRequest::get(message,(Symbol *)local_d0);
  FIX42::OrderCancelRequest::get(message,(Side *)&anon_var_0);
  id = FIX::StringField::operator_cast_to_string_
                 ((StringField *)&symbol.super_StringField.super_FieldBase.m_metrics);
  symbol_00 = FIX::StringField::operator_cast_to_string_((StringField *)local_d0);
  side_00 = convert(this,(Side *)&anon_var_0);
  processCancel(this,id,symbol_00,side_00);
  FIX::Side::~Side((Side *)&anon_var_0);
  FIX::Symbol::~Symbol((Symbol *)local_d0);
  FIX::OrigClOrdID::~OrigClOrdID((OrigClOrdID *)&symbol.super_StringField.super_FieldBase.m_metrics)
  ;
  return;
}

Assistant:

void Application::onMessage(const FIX42::OrderCancelRequest &message, const FIX::SessionID &) {
  FIX::OrigClOrdID origClOrdID;
  FIX::Symbol symbol;
  FIX::Side side;

  message.get(origClOrdID);
  message.get(symbol);
  message.get(side);

  try {
    processCancel(origClOrdID, symbol, convert(side));
  } catch (std::exception &) {}
}